

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogGetSGMLSystem(xmlHashTablePtr catal,xmlChar *sysID)

{
  void *pvVar1;
  xmlChar *pxVar2;
  
  if (catal != (xmlHashTablePtr)0x0) {
    pvVar1 = xmlHashLookup(catal,sysID);
    if ((pvVar1 == (void *)0x0) || (*(int *)((long)pvVar1 + 0x18) != 0xd)) {
      pxVar2 = (xmlChar *)0x0;
    }
    else {
      pxVar2 = *(xmlChar **)((long)pvVar1 + 0x30);
    }
    return pxVar2;
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlCatalogGetSGMLSystem(xmlHashTablePtr catal, const xmlChar *sysID) {
    xmlCatalogEntryPtr entry;

    if (catal == NULL)
	return(NULL);

    entry = (xmlCatalogEntryPtr) xmlHashLookup(catal, sysID);
    if (entry == NULL)
	return(NULL);
    if (entry->type == SGML_CATA_SYSTEM)
	return(entry->URL);
    return(NULL);
}